

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::insert_attribute_after
               (xml_attribute_struct *attr,xml_attribute_struct *place,xml_node_struct *node)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *next;
  xml_node_struct *node_local;
  xml_attribute_struct *place_local;
  xml_attribute_struct *attr_local;
  
  pxVar1 = place->next_attribute;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    node->first_attribute->prev_attribute_c = attr;
  }
  else {
    pxVar1->prev_attribute_c = attr;
  }
  attr->next_attribute = pxVar1;
  attr->prev_attribute_c = place;
  place->next_attribute = attr;
  return;
}

Assistant:

inline void insert_attribute_after(xml_attribute_struct* attr, xml_attribute_struct* place, xml_node_struct* node)
	{
		xml_attribute_struct* next = place->next_attribute;

		if (next)
			next->prev_attribute_c = attr;
		else
			node->first_attribute->prev_attribute_c = attr;

		attr->next_attribute = next;
		attr->prev_attribute_c = place;
		place->next_attribute = attr;
	}